

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# link.c
# Opt level: O1

int link_set_snd_settle_mode(LINK_HANDLE link,sender_settle_mode snd_settle_mode)

{
  LOGGER_LOG p_Var1;
  int iVar2;
  
  if (link == (LINK_HANDLE)0x0) {
    p_Var1 = xlogging_get_log_function();
    iVar2 = 0x3b7;
    if (p_Var1 != (LOGGER_LOG)0x0) {
      (*p_Var1)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/link.c"
                ,"link_set_snd_settle_mode",0x3b6,1,"NULL link");
    }
  }
  else {
    link->snd_settle_mode = snd_settle_mode;
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

int link_set_snd_settle_mode(LINK_HANDLE link, sender_settle_mode snd_settle_mode)
{
    int result;

    if (link == NULL)
    {
        LogError("NULL link");
        result = MU_FAILURE;
    }
    else
    {
        link->snd_settle_mode = snd_settle_mode;
        result = 0;
    }

    return result;
}